

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O0

int Rsb_DecVerify(Rsb_Man_t *p,int nVars,word *f,word **g,int nGs,uint Truth4,word *pTemp1,
                 word *pTemp2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  word wVar4;
  int nWords;
  int nSuppSize;
  int Num;
  int m;
  int b;
  word *pFanins [16];
  uint Truth4_local;
  int nGs_local;
  word **g_local;
  word *f_local;
  int nVars_local;
  Rsb_Man_t *p_local;
  
  iVar1 = Abc_TtWordNum(nVars);
  iVar2 = Vec_IntSize(p->vFanins);
  iVar3 = Vec_IntSize(p->vFanins);
  wVar4 = Abc_Tt6Stretch((ulong)(Truth4 >> ((byte)(1 << ((byte)iVar2 & 0x1f)) & 0x1f)),iVar3);
  iVar2 = Vec_IntSize(p->vFanins);
  Num = 0;
  while( true ) {
    iVar3 = Vec_IntSize(p->vFanins);
    if (iVar3 <= Num) {
      Abc_TtClear(pTemp1,iVar1);
      for (nSuppSize = 0; nSuppSize < 1 << ((byte)iVar2 & 0x1f); nSuppSize = nSuppSize + 1) {
        if (((uint)wVar4 >> ((byte)nSuppSize & 0x1f) & 1) != 0) {
          Abc_TtFill(pTemp2,iVar1);
          for (Num = 0; Num < iVar2; Num = Num + 1) {
            if ((nSuppSize >> ((byte)Num & 0x1f) & 1U) == 0) {
              Abc_TtSharp(pTemp2,pTemp2,*(word **)(&m + (long)Num * 2),iVar1);
            }
            else {
              Abc_TtAnd(pTemp2,pTemp2,*(word **)(&m + (long)Num * 2),iVar1,0);
            }
          }
          Abc_TtOr(pTemp1,pTemp1,pTemp2,iVar1);
        }
      }
      iVar1 = Abc_TtEqual(pTemp1,f,iVar1);
      if (iVar1 == 0) {
        printf("Verification failed.\n");
      }
      return 1;
    }
    iVar3 = Vec_IntEntry(p->vFanins,Num);
    if (nGs <= iVar3) break;
    *(word **)(&m + (long)Num * 2) = g[iVar3];
    Num = Num + 1;
  }
  __assert_fail("Num < nGs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/rsb/rsbDec6.c"
                ,0x23f,
                "int Rsb_DecVerify(Rsb_Man_t *, int, word *, word **, int, unsigned int, word *, word *)"
               );
}

Assistant:

int Rsb_DecVerify( Rsb_Man_t * p, int nVars, word * f, word ** g, int nGs, unsigned Truth4, word * pTemp1, word * pTemp2 )
{
    word * pFanins[16];
    int b, m, Num, nSuppSize;
    int nWords = Abc_TtWordNum(nVars);
    Truth4 >>= (1 << Vec_IntSize(p->vFanins));
    Truth4 = (unsigned)Abc_Tt6Stretch( (word)Truth4, Vec_IntSize(p->vFanins) );
//Kit_DsdPrintFromTruth( (unsigned *)&Truth4, Vec_IntSize(p->vFanins) );
//printf( "\n" );
//    nSuppSize = Rsb_Word6SupportSize( Truth4 );
//    assert( nSuppSize == Vec_IntSize(p->vFanins) );
    nSuppSize = Vec_IntSize(p->vFanins);
    // collect the fanins
    Vec_IntForEachEntry( p->vFanins, Num, b )
    {
        assert( Num < nGs );
        pFanins[b] = g[Num];
    }
    // create the or of ands
    Abc_TtClear( pTemp1, nWords );
    for ( m = 0; m < (1<<nSuppSize); m++ )
    {
        if ( ((Truth4 >> m) & 1) == 0 )
            continue;
        Abc_TtFill( pTemp2, nWords );
        for ( b = 0; b < nSuppSize; b++ )
            if ( (m >> b) & 1 )
                Abc_TtAnd( pTemp2, pTemp2, pFanins[b], nWords, 0 );
            else
                Abc_TtSharp( pTemp2, pTemp2, pFanins[b], nWords );
        Abc_TtOr( pTemp1, pTemp1, pTemp2, nWords );
    }
    // check the function
    if ( !Abc_TtEqual( pTemp1, f, nWords ) )
        printf( "Verification failed.\n" );
//    else
//        printf( "Verification passed.\n" );
    return 1;
}